

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_memory_error.h
# Opt level: O2

double __thiscall nodecpp::error::memory_error_domain::log(memory_error_domain *this,double __x)

{
  bool bVar1;
  LogLevel in_ECX;
  char *pcVar2;
  Log *in_RDX;
  long in_RSI;
  double __x_00;
  double dVar3;
  double extraout_XMM0_Qa;
  string_ref local_40;
  
  bVar1 = impl::isDataStackInfo((StackInfo *)(in_RSI + 8));
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(&local_40,this);
    pcVar2 = "";
    if (local_40.str != (char *)0x0) {
      pcVar2 = local_40.str;
    }
    nodecpp::log::Log::log<char_const*,char_const*>(in_RDX,in_ECX,"{} happened at",pcVar2);
    string_ref::release_str(&local_40);
    dVar3 = StackInfo::log((StackInfo *)(in_RSI + 8),__x_00);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(&local_40,this);
    pcVar2 = "";
    if (local_40.str != (char *)0x0) {
      pcVar2 = local_40.str;
    }
    nodecpp::log::Log::log<char_const*,char_const*>(in_RDX,in_ECX,"{}",pcVar2);
    string_ref::release_str(&local_40);
    dVar3 = extraout_XMM0_Qa;
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::Log& targetLog, log::LogLevel l ) const { 
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				targetLog.log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( targetLog, l );
			}
			else
				targetLog.log( l, "{}", value_to_message( value ).c_str() );
		}